

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::ConditionalExpr> __thiscall
kratos::ConditionalExpr::create
          (ConditionalExpr *this,shared_ptr<kratos::Var> *condition,int64_t left,
          shared_ptr<kratos::Var> *right)

{
  uint32_t width;
  element_type *peVar1;
  bool *pbVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::ConditionalExpr> sVar3;
  undefined1 local_38 [8];
  shared_ptr<kratos::Var> left_const;
  shared_ptr<kratos::Var> *right_local;
  int64_t left_local;
  shared_ptr<kratos::Var> *condition_local;
  
  left_const.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)right;
  peVar1 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      right);
  width = (*(peVar1->super_IRNode)._vptr_IRNode[7])();
  peVar1 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      left_const.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi);
  pbVar2 = Var::is_signed(peVar1);
  Const::constant(left,width,(bool)(*pbVar2 & 1));
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)local_38);
  std::
  make_shared<kratos::ConditionalExpr,std::shared_ptr<kratos::Var>const&,std::shared_ptr<kratos::Var>&,std::shared_ptr<kratos::Var>const&>
            ((shared_ptr<kratos::Var> *)this,condition,(shared_ptr<kratos::Var> *)local_38);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_38);
  sVar3.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<kratos::ConditionalExpr>)
         sVar3.super___shared_ptr<kratos::ConditionalExpr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ConditionalExpr> ConditionalExpr::create(const std::shared_ptr<Var> &condition,
                                                         int64_t left,
                                                         const std::shared_ptr<Var> &right) {
    auto left_const = Const::constant(left, right->width(), right->is_signed()).shared_from_this();
    return std::make_shared<ConditionalExpr>(condition, left_const, right);
}